

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

uint32_t lyht_hash_multi(uint32_t hash,char *key_part,size_t len)

{
  uint uVar1;
  uint local_24;
  uint32_t i;
  size_t len_local;
  char *key_part_local;
  uint32_t hash_local;
  
  if ((key_part == (char *)0x0) || (len == 0)) {
    key_part_local._4_4_ = (hash * 9 >> 0xb ^ hash * 9) * 0x8001;
  }
  else {
    key_part_local._4_4_ = hash;
    for (local_24 = 0; local_24 < len; local_24 = local_24 + 1) {
      uVar1 = ((int)key_part[local_24] + key_part_local._4_4_) * 0x401;
      key_part_local._4_4_ = uVar1 >> 6 ^ uVar1;
    }
  }
  return key_part_local._4_4_;
}

Assistant:

LIBYANG_API_DEF uint32_t
lyht_hash_multi(uint32_t hash, const char *key_part, size_t len)
{
    uint32_t i;

    if (key_part && len) {
        for (i = 0; i < len; ++i) {
            hash += key_part[i];
            hash += (hash << 10);
            hash ^= (hash >> 6);
        }
    } else {
        hash += (hash << 3);
        hash ^= (hash >> 11);
        hash += (hash << 15);
    }

    return hash;
}